

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O2

double __thiscall Confparse::ParseDouble(Confparse *this,char *key,double defaultv)

{
  char *__nptr;
  int *piVar1;
  double dVar2;
  
  __nptr = Parse(this,key);
  if (__nptr != (char *)0x0) {
    dVar2 = strtod(__nptr,(char **)0x0);
    piVar1 = __errno_location();
    if (*piVar1 != 0x22) {
      defaultv = dVar2;
    }
  }
  return defaultv;
}

Assistant:

double Confparse::ParseDouble(const char *key, double defaultv) {
	char *p = Parse(key);
	if (p) {
		double v = strtod(p, NULL);
		if (errno == ERANGE)
			return defaultv;
		else
			return v;

	} else
		return defaultv;
}